

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

real __thiscall fasttext::DenseMatrix::l2NormRow(DenseMatrix *this,int64_t i)

{
  float fVar1;
  ulong uVar2;
  pointer pfVar3;
  runtime_error *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  uVar2 = (this->super_Matrix).n_;
  if ((long)uVar2 < 1) {
    dVar8 = 0.0;
  }
  else {
    uVar7 = i * uVar2;
    pfVar3 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
    uVar6 = 0;
    uVar5 = uVar4 - uVar7;
    if (uVar4 < uVar7) {
      uVar5 = uVar6;
    }
    dVar8 = 0.0;
    do {
      if (uVar5 <= uVar2 - 1) {
        __assert_fail("i * n_ + j < data_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.h"
                      ,0x2d,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
      }
      fVar1 = pfVar3[uVar7 + uVar6];
      dVar8 = dVar8 + (double)(fVar1 * fVar1);
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar8;
  if (NAN(dVar8)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Encountered NaN.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar8 = auVar9._0_8_;
  }
  return (float)dVar8;
}

Assistant:

real DenseMatrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return std::sqrt(norm);
}